

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeDelete(BtCursor *pCur,u8 flags)

{
  ushort uVar1;
  u32 uVar2;
  Btree *pBtree;
  BtShared *pBt;
  MemPage *pPage;
  MemPage *pPage_00;
  u8 *puVar3;
  u8 *pTemp;
  int iVar4;
  char cVar5;
  u16 uVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  uchar *pCell;
  uint uVar10;
  undefined7 in_register_00000031;
  uchar *puVar11;
  MemPage **ppMVar12;
  char cVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  CellInfo info;
  int local_74;
  uint local_70;
  int local_6c;
  ulong local_68;
  Pgno local_60;
  undefined4 local_5c;
  ulong local_58;
  long local_50;
  CellInfo local_48;
  
  uVar10 = (uint)CONCAT71(in_register_00000031,flags);
  pBtree = pCur->pBtree;
  pBt = pBtree->pBt;
  uVar14 = uVar10;
  if (pCur->eState != 0) {
    if (pCur->eState < 3) {
      uVar9 = 0x12ecb;
      goto LAB_00161962;
    }
    iVar7 = btreeRestoreCursorPosition(pCur);
    if (iVar7 != 0) {
      return iVar7;
    }
    local_74 = 0;
    if (pCur->eState != '\0') {
      return 0;
    }
  }
  uVar15 = (ulong)pCur->ix;
  pPage = pCur->pPage;
  if (pPage->nCell <= pCur->ix) {
    uVar9 = 0x12ed4;
LAB_00161962:
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar9,
                "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
    return 0xb;
  }
  local_6c = (int)pCur->iPage;
  pCell = pPage->aData +
          (CONCAT11(pPage->aCellIdx[uVar15 * 2],pPage->aCellIdx[uVar15 * 2 + 1]) & pPage->maskPage);
  local_70 = uVar10;
  if ((pPage->nFree < 0) && (iVar7 = btreeComputeFreeSpace(pPage), iVar7 != 0)) {
    uVar9 = 0x12ed8;
    goto LAB_00161962;
  }
  local_68 = uVar15;
  if ((local_70 & 2) != 0) {
    if (pPage->leaf != '\0') {
      iVar7 = pPage->nFree;
      puVar11 = pCell;
      uVar6 = (*pPage->xCellSize)(pPage,pCell);
      uVar14 = (uint)puVar11;
      iVar7 = (uint)uVar6 + iVar7 + 2;
      if ((iVar7 <= (int)((pBt->usableSize * 2) / 3)) &&
         (local_5c = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar7 >> 8),1), pPage->nCell != 1))
      goto LAB_001617b0;
    }
    local_74 = saveCursorKey(pCur);
    if (local_74 != 0) {
      return local_74;
    }
  }
  local_5c = 0;
LAB_001617b0:
  if ((pPage->leaf == '\0') && (local_74 = sqlite3BtreePrevious(pCur,uVar14), local_74 != 0)) {
    return local_74;
  }
  if (((pCur->curFlags & 0x20) != 0) &&
     (local_74 = saveAllCursors(pBt,pCur->pgnoRoot,pCur), local_74 != 0)) {
    return local_74;
  }
  if ((pCur->pKeyInfo == (KeyInfo *)0x0) && (pBtree->hasIncrblobCur != '\0')) {
    invalidateIncrblobCursors(pBtree,pCur->pgnoRoot,(pCur->info).nKey,0);
  }
  local_74 = sqlite3PagerWrite(pPage->pDbPage);
  if (local_74 != 0) {
    return local_74;
  }
  (*pPage->xParseCell)(pPage,pCell,&local_48);
  iVar7 = 0;
  if (local_48.nPayload != local_48.nLocal) {
    iVar7 = clearCellOverflow(pPage,pCell,&local_48);
  }
  local_74 = iVar7;
  dropCell(pPage,(int)local_68,(uint)local_48.nSize,&local_74);
  if (local_74 != 0) {
    return local_74;
  }
  local_50 = (long)local_6c;
  if (pPage->leaf == '\0') {
    pPage_00 = pCur->pPage;
    if ((pPage_00->nFree < 0) &&
       (iVar7 = btreeComputeFreeSpace(pPage_00), local_74 = iVar7, iVar7 != 0)) {
      bVar16 = false;
    }
    else {
      ppMVar12 = &pCur->pPage;
      if ((int)local_50 < pCur->iPage + -1) {
        ppMVar12 = pCur->apPage + local_50 + 1;
      }
      uVar14 = (uint)(CONCAT11(pPage_00->aCellIdx[(ulong)pPage_00->nCell * 2 + -2],
                               pPage_00->aCellIdx[(ulong)pPage_00->nCell * 2 + -1]) &
                     pPage_00->maskPage);
      if (uVar14 < 4) {
        bVar16 = false;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12f33,
                    "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
        iVar7 = 0xb;
      }
      else {
        local_60 = (*ppMVar12)->pgno;
        puVar3 = pPage_00->aData;
        uVar6 = (*pPage_00->xCellSize)(pPage_00,puVar3 + uVar14);
        local_58 = (ulong)uVar6;
        pTemp = pBt->pTmpSpace;
        local_74 = sqlite3PagerWrite(pPage_00->pDbPage);
        if (local_74 == 0) {
          insertCell(pPage,(int)local_68,puVar3 + uVar14 + -4,(int)local_58 + 4,pTemp,local_60,
                     &local_74);
        }
        dropCell(pPage_00,pPage_00->nCell - 1,(int)local_58,&local_74);
        bVar16 = local_74 == 0;
        iVar7 = local_74;
      }
    }
    if (!bVar16) {
      return iVar7;
    }
  }
  uVar14 = local_70;
  iVar7 = pCur->pPage->nFree * 3;
  uVar2 = pCur->pBt->usableSize;
  iVar4 = uVar2 * 2;
  iVar8 = 0;
  if (iVar7 != iVar4 && SBORROW4(iVar7,iVar4) == (int)(iVar7 + uVar2 * -2) < 0) {
    iVar8 = balance(pCur);
  }
  uVar15 = local_68;
  local_74 = iVar8;
  if ((iVar8 == 0) && (cVar13 = (char)local_50, cVar13 < pCur->iPage)) {
    sqlite3PagerUnrefNotNull(pCur->pPage->pDbPage);
    cVar5 = pCur->iPage + -1;
    pCur->iPage = cVar5;
    if ((char)local_6c < cVar5) {
      do {
        pCur->iPage = cVar5 + -1;
        if (pCur->apPage[cVar5] != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(pCur->apPage[cVar5]->pDbPage);
        }
        cVar5 = pCur->iPage;
      } while (cVar13 < cVar5);
    }
    pCur->pPage = pCur->apPage[cVar5];
    local_74 = balance(pCur);
  }
  if (local_74 != 0) {
    return local_74;
  }
  if ((char)local_5c != '\0') {
    pCur->eState = '\x02';
    uVar1 = pPage->nCell;
    if ((ushort)uVar15 < uVar1) {
      pCur->skipNext = 1;
      return 0;
    }
    pCur->skipNext = -1;
    pCur->ix = uVar1 - 1;
    return 0;
  }
  iVar7 = moveToRoot(pCur);
  local_74 = iVar7;
  if ((uVar14 & 2) != 0) {
    btreeReleaseAllCursorPages(pCur);
    pCur->eState = '\x03';
  }
  if (iVar7 != 0x10) {
    return local_74;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDelete(BtCursor *pCur, u8 flags){
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;
  int rc;                    /* Return code */
  MemPage *pPage;            /* Page to delete cell from */
  unsigned char *pCell;      /* Pointer to cell to delete */
  int iCellIdx;              /* Index of cell to delete */
  int iCellDepth;            /* Depth of node containing pCell */
  CellInfo info;             /* Size of the cell being deleted */
  u8 bPreserve;              /* Keep cursor valid.  2 for CURSOR_SKIPNEXT */

  assert( cursorOwnsBtShared(pCur) );
  assert( pBt->inTransaction==TRANS_WRITE );
  assert( (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( pCur->curFlags & BTCF_WriteFlag );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );
  assert( !hasReadConflicts(p, pCur->pgnoRoot) );
  assert( (flags & ~(BTREE_SAVEPOSITION | BTREE_AUXDELETE))==0 );
  if( pCur->eState!=CURSOR_VALID ){
    if( pCur->eState>=CURSOR_REQUIRESEEK ){
      rc = btreeRestoreCursorPosition(pCur);
      assert( rc!=SQLITE_OK || CORRUPT_DB || pCur->eState==CURSOR_VALID );
      if( rc || pCur->eState!=CURSOR_VALID ) return rc;
    }else{
      return SQLITE_CORRUPT_BKPT;
    }
  }
  assert( pCur->eState==CURSOR_VALID );

  iCellDepth = pCur->iPage;
  iCellIdx = pCur->ix;
  pPage = pCur->pPage;
  if( pPage->nCell<=iCellIdx ){
    return SQLITE_CORRUPT_BKPT;
  }
  pCell = findCell(pPage, iCellIdx);
  if( pPage->nFree<0 && btreeComputeFreeSpace(pPage) ){
    return SQLITE_CORRUPT_BKPT;
  }

  /* If the BTREE_SAVEPOSITION bit is on, then the cursor position must
  ** be preserved following this delete operation. If the current delete
  ** will cause a b-tree rebalance, then this is done by saving the cursor
  ** key and leaving the cursor in CURSOR_REQUIRESEEK state before
  ** returning.
  **
  ** If the current delete will not cause a rebalance, then the cursor
  ** will be left in CURSOR_SKIPNEXT state pointing to the entry immediately
  ** before or after the deleted entry.
  **
  ** The bPreserve value records which path is required:
  **
  **    bPreserve==0         Not necessary to save the cursor position
  **    bPreserve==1         Use CURSOR_REQUIRESEEK to save the cursor position
  **    bPreserve==2         Cursor won't move.  Set CURSOR_SKIPNEXT.
  */
  bPreserve = (flags & BTREE_SAVEPOSITION)!=0;
  if( bPreserve ){
    if( !pPage->leaf
     || (pPage->nFree+pPage->xCellSize(pPage,pCell)+2) >
                                                   (int)(pBt->usableSize*2/3)
     || pPage->nCell==1  /* See dbfuzz001.test for a test case */
    ){
      /* A b-tree rebalance will be required after deleting this entry.
      ** Save the cursor key.  */
      rc = saveCursorKey(pCur);
      if( rc ) return rc;
    }else{
      bPreserve = 2;
    }
  }

  /* If the page containing the entry to delete is not a leaf page, move
  ** the cursor to the largest entry in the tree that is smaller than
  ** the entry being deleted. This cell will replace the cell being deleted
  ** from the internal node. The 'previous' entry is used for this instead
  ** of the 'next' entry, as the previous entry is always a part of the
  ** sub-tree headed by the child page of the cell being deleted. This makes
  ** balancing the tree following the delete operation easier.  */
  if( !pPage->leaf ){
    rc = sqlite3BtreePrevious(pCur, 0);
    assert( rc!=SQLITE_DONE );
    if( rc ) return rc;
  }

  /* Save the positions of any other cursors open on this table before
  ** making any modifications.  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  /* If this is a delete operation to remove a row from a table b-tree,
  ** invalidate any incrblob cursors open on the row being deleted.  */
  if( pCur->pKeyInfo==0 && p->hasIncrblobCur ){
    invalidateIncrblobCursors(p, pCur->pgnoRoot, pCur->info.nKey, 0);
  }

  /* Make the page containing the entry to be deleted writable. Then free any
  ** overflow pages associated with the entry and finally remove the cell
  ** itself from within the page.  */
  rc = sqlite3PagerWrite(pPage->pDbPage);
  if( rc ) return rc;
  BTREE_CLEAR_CELL(rc, pPage, pCell, info);
  dropCell(pPage, iCellIdx, info.nSize, &rc);
  if( rc ) return rc;

  /* If the cell deleted was not located on a leaf page, then the cursor
  ** is currently pointing to the largest entry in the sub-tree headed
  ** by the child-page of the cell that was just deleted from an internal
  ** node. The cell from the leaf node needs to be moved to the internal
  ** node to replace the deleted cell.  */
  if( !pPage->leaf ){
    MemPage *pLeaf = pCur->pPage;
    int nCell;
    Pgno n;
    unsigned char *pTmp;

    if( pLeaf->nFree<0 ){
      rc = btreeComputeFreeSpace(pLeaf);
      if( rc ) return rc;
    }
    if( iCellDepth<pCur->iPage-1 ){
      n = pCur->apPage[iCellDepth+1]->pgno;
    }else{
      n = pCur->pPage->pgno;
    }
    pCell = findCell(pLeaf, pLeaf->nCell-1);
    if( pCell<&pLeaf->aData[4] ) return SQLITE_CORRUPT_BKPT;
    nCell = pLeaf->xCellSize(pLeaf, pCell);
    assert( MX_CELL_SIZE(pBt) >= nCell );
    pTmp = pBt->pTmpSpace;
    assert( pTmp!=0 );
    rc = sqlite3PagerWrite(pLeaf->pDbPage);
    if( rc==SQLITE_OK ){
      insertCell(pPage, iCellIdx, pCell-4, nCell+4, pTmp, n, &rc);
    }
    dropCell(pLeaf, pLeaf->nCell-1, nCell, &rc);
    if( rc ) return rc;
  }

  /* Balance the tree. If the entry deleted was located on a leaf page,
  ** then the cursor still points to that page. In this case the first
  ** call to balance() repairs the tree, and the if(...) condition is
  ** never true.
  **
  ** Otherwise, if the entry deleted was on an internal node page, then
  ** pCur is pointing to the leaf page from which a cell was removed to
  ** replace the cell deleted from the internal node. This is slightly
  ** tricky as the leaf node may be underfull, and the internal node may
  ** be either under or overfull. In this case run the balancing algorithm
  ** on the leaf node first. If the balance proceeds far enough up the
  ** tree that we can be sure that any problem in the internal node has
  ** been corrected, so be it. Otherwise, after balancing the leaf node,
  ** walk the cursor up the tree to the internal node and balance it as
  ** well.  */
  assert( pCur->pPage->nOverflow==0 );
  assert( pCur->pPage->nFree>=0 );
  if( pCur->pPage->nFree*3<=(int)pCur->pBt->usableSize*2 ){
    /* Optimization: If the free space is less than 2/3rds of the page,
    ** then balance() will always be a no-op.  No need to invoke it. */
    rc = SQLITE_OK;
  }else{
    rc = balance(pCur);
  }
  if( rc==SQLITE_OK && pCur->iPage>iCellDepth ){
    releasePageNotNull(pCur->pPage);
    pCur->iPage--;
    while( pCur->iPage>iCellDepth ){
      releasePage(pCur->apPage[pCur->iPage--]);
    }
    pCur->pPage = pCur->apPage[pCur->iPage];
    rc = balance(pCur);
  }

  if( rc==SQLITE_OK ){
    if( bPreserve>1 ){
      assert( (pCur->iPage==iCellDepth || CORRUPT_DB) );
      assert( pPage==pCur->pPage || CORRUPT_DB );
      assert( (pPage->nCell>0 || CORRUPT_DB) && iCellIdx<=pPage->nCell );
      pCur->eState = CURSOR_SKIPNEXT;
      if( iCellIdx>=pPage->nCell ){
        pCur->skipNext = -1;
        pCur->ix = pPage->nCell-1;
      }else{
        pCur->skipNext = 1;
      }
    }else{
      rc = moveToRoot(pCur);
      if( bPreserve ){
        btreeReleaseAllCursorPages(pCur);
        pCur->eState = CURSOR_REQUIRESEEK;
      }
      if( rc==SQLITE_EMPTY ) rc = SQLITE_OK;
    }
  }
  return rc;
}